

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Store::Store(Store *this,Features *features)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Object *this_00;
  Index index;
  Object *local_28;
  Ref local_20;
  Ref ref;
  Features *features_local;
  Store *this_local;
  
  bVar7 = features->mutable_globals_enabled_;
  bVar1 = features->sat_float_to_int_enabled_;
  bVar2 = features->sign_extension_enabled_;
  bVar3 = features->simd_enabled_;
  bVar4 = features->threads_enabled_;
  bVar5 = features->multi_value_enabled_;
  bVar6 = features->tail_call_enabled_;
  (this->features_).exceptions_enabled_ = features->exceptions_enabled_;
  (this->features_).mutable_globals_enabled_ = bVar7;
  (this->features_).sat_float_to_int_enabled_ = bVar1;
  (this->features_).sign_extension_enabled_ = bVar2;
  (this->features_).simd_enabled_ = bVar3;
  (this->features_).threads_enabled_ = bVar4;
  (this->features_).multi_value_enabled_ = bVar5;
  (this->features_).tail_call_enabled_ = bVar6;
  bVar7 = features->reference_types_enabled_;
  bVar1 = features->annotations_enabled_;
  bVar2 = features->gc_enabled_;
  (this->features_).bulk_memory_enabled_ = features->bulk_memory_enabled_;
  (this->features_).reference_types_enabled_ = bVar7;
  (this->features_).annotations_enabled_ = bVar1;
  (this->features_).gc_enabled_ = bVar2;
  ref.index = (size_t)features;
  FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>::
  FreeList(&this->objects_);
  FreeList<wabt::interp::Ref>::FreeList(&this->roots_);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->marks_);
  this_00 = (Object *)operator_new(0x40);
  Object::Object(this_00,Null);
  local_28 = this_00;
  index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
          ::New<wabt::interp::Object*>
                    ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                      *)&this->objects_,&local_28);
  Ref::Ref(&local_20,index);
  bVar7 = interp::operator==(local_20,Ref::Null);
  if (!bVar7) {
    __assert_fail("ref == Ref::Null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp.cc"
                  ,0xc6,"wabt::interp::Store::Store(const Features &)");
  }
  FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&this->roots_,&local_20);
  return;
}

Assistant:

Store::Store(const Features& features) : features_(features) {
  Ref ref{objects_.New(new Object(ObjectKind::Null))};
  assert(ref == Ref::Null);
  roots_.New(ref);
}